

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setMinimumSize(QWidget *this,int minw,int minh)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QWidgetPrivate *pQVar4;
  int *piVar5;
  pointer pQVar6;
  int in_EDX;
  int in_ESI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  WidgetAttribute unaff_retaddr_00;
  QWidget *in_stack_00000008;
  bool maximized;
  bool resized;
  QWidgetPrivate *d;
  undefined4 in_stack_ffffffffffffffa0;
  WidgetAttribute in_stack_ffffffffffffffa4;
  QWidget *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  qint32 qVar7;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined1 forceUpdate;
  QWidgetPrivate *this_00;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar4 = d_func((QWidget *)0x36ab92);
  forceUpdate = (undefined1)((ulong)pQVar4 >> 0x38);
  bVar2 = QWidgetPrivate::setMinimumSize_helper
                    ((QWidgetPrivate *)CONCAT44(in_ESI,in_EDX),
                     (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (int *)this_00);
  if (bVar2) {
    bVar2 = isWindow((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (bVar2) {
      QWidgetPrivate::setConstraints_sys(in_RDI);
    }
    iVar3 = width((QWidget *)0x36abe0);
    if ((iVar3 < in_ESI) || (iVar3 = height((QWidget *)0x36abfc), iVar3 < in_EDX)) {
      testAttribute(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      bVar2 = isMaximized((QWidget *)in_RDI);
      width((QWidget *)0x36ac39);
      piVar5 = qMax<int>((int *)&stack0xfffffffffffffff4,(int *)&stack0xffffffffffffffec);
      in_stack_ffffffffffffffbc = *piVar5;
      height((QWidget *)0x36ac5c);
      qMax<int>((int *)&stack0xfffffffffffffff0,(int *)&stack0xffffffffffffffe8);
      resize((QWidget *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8);
      setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
      if (bVar2) {
        *(uint *)(*(long *)&in_RDI->field_0x20 + 0x10) =
             *(uint *)(*(long *)&in_RDI->field_0x20 + 0x10) & 0xfffffff0 |
             *(uint *)(*(long *)&in_RDI->field_0x20 + 0x10) & 0xf | 2;
      }
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36acd2);
    if ((bVar2) &&
       (pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36ace6),
       pQVar6->proxyWidget != (QGraphicsProxyWidget *)0x0)) {
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36acfb);
      QGraphicsLayoutItem::setMinimumSize
                ((QGraphicsLayoutItem *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (qreal)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (qreal)in_stack_ffffffffffffffa8);
    }
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36ad2e);
    qVar7 = pQVar6->minw;
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36ad43);
    if (qVar7 == pQVar6->maxw) {
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36ad63);
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36ad78);
    }
    QWidgetPrivate::updateGeometry_helper(this_00,(bool)forceUpdate);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setMinimumSize(int minw, int minh)
{
    Q_D(QWidget);
    if (!d->setMinimumSize_helper(minw, minh))
        return;

    if (isWindow())
        d->setConstraints_sys();
    if (minw > width() || minh > height()) {
        bool resized = testAttribute(Qt::WA_Resized);
        bool maximized = isMaximized();
        resize(qMax(minw,width()), qMax(minh,height()));
        setAttribute(Qt::WA_Resized, resized); //not a user resize
        if (maximized)
            data->window_state = data->window_state | Qt::WindowMaximized;
    }
#if QT_CONFIG(graphicsview)
    if (d->extra) {
        if (d->extra->proxyWidget)
            d->extra->proxyWidget->setMinimumSize(minw, minh);
    }
#endif
    d->updateGeometry_helper(d->extra->minw == d->extra->maxw && d->extra->minh == d->extra->maxh);
}